

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_cmp(TCGContext_conflict9 *s,TCGArg arg1,TCGArg arg2,int const_arg2,int rexw)

{
  int dest;
  int rexw_local;
  int const_arg2_local;
  TCGArg arg2_local;
  TCGArg arg1_local;
  TCGContext_conflict9 *s_local;
  
  dest = (int)arg1;
  if (const_arg2 == 0) {
    tgen_arithr(s,rexw + 7,dest,(int)arg2);
  }
  else if (arg2 == 0) {
    tcg_out_modrm(s,rexw + 0x85,dest,dest);
  }
  else {
    tgen_arithi(s,rexw + 7,dest,arg2,0);
  }
  return;
}

Assistant:

static void tcg_out_cmp(TCGContext *s, TCGArg arg1, TCGArg arg2,
                        int const_arg2, int rexw)
{
    if (const_arg2) {
        if (arg2 == 0) {
            /* test r, r */
            tcg_out_modrm(s, OPC_TESTL + rexw, arg1, arg1);
        } else {
            tgen_arithi(s, ARITH_CMP + rexw, arg1, arg2, 0);
        }
    } else {
        tgen_arithr(s, ARITH_CMP + rexw, arg1, arg2);
    }
}